

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimhelpers.cpp
# Opt level: O0

string * btorsim_bv_to_hex_string_abi_cxx11_(BtorSimBitVector *bv)

{
  char *pcVar1;
  string *in_RDI;
  char *bv_char;
  string *res;
  BtorSimBitVector *in_stack_ffffffffffffffd0;
  allocator local_1a;
  undefined1 local_19;
  char *local_18;
  
  pcVar1 = btorsim_bv_to_hex_char(in_stack_ffffffffffffffd0);
  local_19 = 0;
  local_18 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar1,&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  free(local_18);
  return in_RDI;
}

Assistant:

std::string
btorsim_bv_to_hex_string (const BtorSimBitVector *bv)
{
  char *bv_char = btorsim_bv_to_hex_char (bv);
  std::string res (bv_char);
  BTOR2_DELETE (bv_char);
  return res;
}